

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerSettings.cpp
# Opt level: O1

char * __thiscall HdlcAnalyzerSettings::SaveSettings(HdlcAnalyzerSettings *this)

{
  char *pcVar1;
  SimpleArchive text_archive;
  SimpleArchive aSStack_18 [8];
  
  SimpleArchive::SimpleArchive(aSStack_18);
  SimpleArchive::operator<<(aSStack_18,&this->mInputChannel);
  SimpleArchive::operator<<(aSStack_18,this->mBitRate);
  SimpleArchive::operator<<(aSStack_18,this->mTransmissionMode);
  SimpleArchive::operator<<(aSStack_18,this->mHdlcAddr);
  SimpleArchive::operator<<(aSStack_18,this->mHdlcControl);
  SimpleArchive::operator<<(aSStack_18,this->mHdlcFcs);
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(aSStack_18);
  return pcVar1;
}

Assistant:

const char* HdlcAnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;

    text_archive << mInputChannel;
    text_archive << mBitRate;
    text_archive << U32( mTransmissionMode );
    text_archive << U32( mHdlcAddr );
    text_archive << U32( mHdlcControl );
    text_archive << U32( mHdlcFcs );

    return SetReturnString( text_archive.GetString() );
}